

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  Argument *pAVar1;
  ostream *poVar2;
  string_view local_670;
  undefined1 local_660 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator<char> local_609;
  string local_608;
  undefined1 local_5e8 [8];
  server_t s;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_221;
  string local_220;
  undefined1 local_200 [8];
  ArgumentParser program;
  char **argv_local;
  int argc_local;
  
  program._480_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"file",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"devel",&local_259);
  argparse::ArgumentParser::ArgumentParser
            ((ArgumentParser *)local_200,&local_220,&local_258,all,true,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pAVar1 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_200,"-dir");
  pAVar1 = argparse::Argument::default_value(pAVar1,"./public");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"public directory",&local_281);
  pAVar1 = argparse::Argument::help(pAVar1,&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"PUBLIC_DIR",&local_2a9);
  pAVar1 = argparse::Argument::metavar(pAVar1,&local_2a8);
  argparse::Argument::nargs(pAVar1,1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  pAVar1 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_200,"-addr");
  pAVar1 = argparse::Argument::default_value(pAVar1,"0.0.0.0:8080");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"server address",&local_2d1);
  pAVar1 = argparse::Argument::help(pAVar1,&local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"ADDR",(allocator<char> *)&s.log.field_0x187);
  pAVar1 = argparse::Argument::metavar(pAVar1,&local_2f8);
  argparse::Argument::nargs(pAVar1,1);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&s.log.field_0x187);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  argparse::ArgumentParser::parse_args((ArgumentParser *)local_200,argc,(char **)program._480_8_);
  clask::server();
  clask::logger::default_level = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"/",&local_609);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&addr.field_2 + 8),"-dir");
  argparse::ArgumentParser::get<std::__cxx11::string>
            (&local_630,(ArgumentParser *)local_200,stack0xfffffffffffff9c0);
  clask::server_t::static_dir((server_t *)local_5e8,&local_608,&local_630,false);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_670,"-addr");
  argparse::ArgumentParser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660,
             (ArgumentParser *)local_200,local_670);
  poVar2 = std::operator<<((ostream *)&std::cerr,"started ");
  poVar2 = std::operator<<(poVar2,(string *)local_660);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  clask::server_t::run((server_t *)local_5e8,(string *)local_660);
  std::__cxx11::string::~string((string *)local_660);
  clask::server_t::~server_t((server_t *)local_5e8);
  argparse::ArgumentParser::~ArgumentParser((ArgumentParser *)local_200);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  argparse::ArgumentParser program("file", CLASK_VERSION);
  program.add_argument("-dir")
      .default_value("./public")
      .help("public directory")
      .metavar("PUBLIC_DIR")
      .nargs(1);
  program.add_argument("-addr")
      .default_value("0.0.0.0:8080")
      .help("server address")
      .metavar("ADDR")
      .nargs(1);
  program.parse_args(argc, argv);

  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/", program.get<std::string>("-dir"));

  auto addr = program.get<std::string>("-addr");
  std::cerr << "started " << addr << std::endl;
  s.run(addr);
}